

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

bool google::protobuf::anon_unknown_6::IsIndexInHasBitSet
               (uint32_t *has_bit_set,uint32_t has_bit_index)

{
  Nonnull<const_char_*> pcVar1;
  
  if (has_bit_index == 0xffffffff) {
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((ulong)has_bit_index,0xffffffff,"has_bit_index != ~0u");
  }
  else {
    pcVar1 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    return (has_bit_set[has_bit_index >> 5] >> (has_bit_index & 0x1f) & 1) != 0;
  }
  _GLOBAL__N_1::IsIndexInHasBitSet();
}

Assistant:

bool IsIndexInHasBitSet(const uint32_t* has_bit_set, uint32_t has_bit_index) {
  ABSL_DCHECK_NE(has_bit_index, ~0u);
  return ((has_bit_set[has_bit_index / 32] >> (has_bit_index % 32)) &
          static_cast<uint32_t>(1)) != 0;
}